

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase464::run(TestCase464 *this)

{
  bool bVar1;
  AsyncIoProvider *pAVar2;
  AsyncIoStream *pAVar3;
  ArrayPtr<const_unsigned_char> AVar4;
  bool local_1d1;
  DebugExpression<const_char_(&)[4]> DStack_1d0;
  bool _kj_shouldLog_1;
  undefined1 local_1c8 [8];
  DebugComparison<const_char_(&)[4],_kj::String_&> _kjCondition_1;
  DebugExpression<const_char_(&)[4]> DStack_198;
  bool _kj_shouldLog;
  undefined1 local_190 [8];
  DebugComparison<const_char_(&)[4],_kj::String_&> _kjCondition;
  SourceLocation local_160;
  undefined1 local_148 [8];
  String result2;
  SourceLocation local_128;
  undefined1 *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  ArrayPtr<const_unsigned_char> local_f8;
  Type local_e8;
  Promise<unsigned_long> local_d8;
  undefined1 local_d0 [8];
  String result;
  Type local_90;
  Promise<unsigned_long> local_80;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:473:11),_unsigned_long>
  promise;
  undefined4 local_70;
  char receiveBuffer2 [4];
  char receiveBuffer1 [4];
  undefined1 local_60 [8];
  TwoWayPipe pipe;
  AsyncIoContext ioContext;
  TestCase464 *this_local;
  
  ioContext.unixEventPort = (UnixEventPort *)this;
  setupAsyncIo();
  pAVar2 = Own<kj::AsyncIoProvider,_std::nullptr_t>::operator->
                     ((Own<kj::AsyncIoProvider,_std::nullptr_t> *)&ioContext.lowLevelProvider.ptr);
  (*pAVar2->_vptr_AsyncIoProvider[1])(local_60);
  local_70 = 0;
  promise.super_PromiseBase.node.ptr._4_4_ = 0;
  pAVar3 = Own<kj::AsyncIoStream,_std::nullptr_t>::operator->
                     ((Own<kj::AsyncIoStream,_std::nullptr_t> *)local_60);
  AVar4 = operator___kjb<kj::_::ByteLiteral<4UL>__102,_111,_111__>();
  (**(pAVar3->super_AsyncOutputStream)._vptr_AsyncOutputStream)
            (&local_90,&pAVar3->super_AsyncOutputStream,AVar4.ptr,AVar4.size_);
  Promise<void>::then<kj::(anonymous_namespace)::TestCase464::run()::__0>
            ((Promise<void> *)&local_90.receiveBuffer1,&local_90);
  result.content.disposer = (ArrayDisposer *)&stack0xffffffffffffff90;
  Promise<unsigned_long>::then<kj::(anonymous_namespace)::TestCase464::run()::__1>
            (&local_80,(Type *)&local_90.receiveBuffer1);
  Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)&local_90.receiveBuffer1);
  Promise<void>::~Promise((Promise<void> *)&local_90);
  pAVar3 = Own<kj::AsyncIoStream,_std::nullptr_t>::operator->
                     ((Own<kj::AsyncIoStream,_std::nullptr_t> *)&pipe.ends[0].ptr);
  local_f8 = operator___kjb<kj::_::ByteLiteral<4UL>__98,_97,_114__>();
  (**(pAVar3->super_AsyncOutputStream)._vptr_AsyncOutputStream)
            (&local_e8,&pAVar3->super_AsyncOutputStream,local_f8.ptr,local_f8.size_);
  local_108 = local_60;
  local_100 = (undefined1 *)((long)&promise.super_PromiseBase.node.ptr + 4);
  Promise<void>::then<kj::(anonymous_namespace)::TestCase464::run()::__2>
            ((Promise<void> *)&local_e8.receiveBuffer2,&local_e8);
  local_110 = (undefined1 *)((long)&promise.super_PromiseBase.node.ptr + 4);
  Promise<unsigned_long>::then<kj::(anonymous_namespace)::TestCase464::run()::__3>
            (&local_d8,(Type *)&local_e8.receiveBuffer2);
  SourceLocation::SourceLocation
            (&local_128,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
             ,"run",0x1de,0x17);
  Promise<kj::String>::wait((Promise<kj::String> *)local_d0,&local_d8);
  Promise<kj::String>::~Promise((Promise<kj::String> *)&local_d8);
  Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)&local_e8.receiveBuffer2);
  Promise<void>::~Promise((Promise<void> *)&local_e8);
  SourceLocation::SourceLocation
            (&local_160,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
             ,"run",0x1e5,0x18);
  Promise<kj::String>::wait((Promise<kj::String> *)local_148,&local_80);
  DStack_198 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])0x9422c6);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_kj::String_&> *)local_190,
             (DebugExpression<char_const(&)[4]> *)&stack0xfffffffffffffe68,(String *)local_d0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_190);
  if (!bVar1) {
    _kjCondition_1._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_1._39_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[37],kj::_::DebugComparison<char_const(&)[4],kj::String&>&,char_const(&)[4],kj::String&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
                 ,0x1e7,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (result)\", _kjCondition, \"foo\", result"
                 ,(char (*) [37])"failed: expected (\"foo\") == (result)",
                 (DebugComparison<const_char_(&)[4],_kj::String_&> *)local_190,
                 (char (*) [4])0x9422c6,(String *)local_d0);
      _kjCondition_1._39_1_ = 0;
    }
  }
  DStack_1d0 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])0x91cc8d);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_kj::String_&> *)local_1c8,
             (DebugExpression<char_const(&)[4]> *)&stack0xfffffffffffffe30,(String *)local_148);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1c8);
  if (!bVar1) {
    local_1d1 = kj::_::Debug::shouldLog(ERROR);
    while (local_1d1 != false) {
      kj::_::Debug::
      log<char_const(&)[38],kj::_::DebugComparison<char_const(&)[4],kj::String&>&,char_const(&)[4],kj::String&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
                 ,0x1e8,ERROR,
                 "\"failed: expected \" \"(\\\"bar\\\") == (result2)\", _kjCondition, \"bar\", result2"
                 ,(char (*) [38])"failed: expected (\"bar\") == (result2)",
                 (DebugComparison<const_char_(&)[4],_kj::String_&> *)local_1c8,
                 (char (*) [4])0x91cc8d,(String *)local_148);
      local_1d1 = false;
    }
  }
  String::~String((String *)local_148);
  String::~String((String *)local_d0);
  Promise<kj::String>::~Promise((Promise<kj::String> *)&local_80);
  TwoWayPipe::~TwoWayPipe((TwoWayPipe *)local_60);
  AsyncIoContext::~AsyncIoContext((AsyncIoContext *)&pipe.ends[1].ptr);
  return;
}

Assistant:

TEST(AsyncIo, TwoWayPipe) {
  auto ioContext = setupAsyncIo();

  auto pipe = ioContext.provider->newTwoWayPipe();
  char receiveBuffer1[4]{};
  char receiveBuffer2[4]{};

  auto promise = pipe.ends[0]->write("foo"_kjb).then([&]() {
    return pipe.ends[0]->tryRead(receiveBuffer1, 3, 4);
  }).then([&](size_t n) {
    EXPECT_EQ(3u, n);
    return heapString(receiveBuffer1, n);
  });

  kj::String result = pipe.ends[1]->write("bar"_kjb).then([&]() {
    return pipe.ends[1]->tryRead(receiveBuffer2, 3, 4);
  }).then([&](size_t n) {
    EXPECT_EQ(3u, n);
    return heapString(receiveBuffer2, n);
  }).wait(ioContext.waitScope);

  kj::String result2 = promise.wait(ioContext.waitScope);

  EXPECT_EQ("foo", result);
  EXPECT_EQ("bar", result2);
}